

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Gym_Emu.cpp
# Opt level: O3

void __thiscall Gym_Emu::set_tempo_(Gym_Emu *this,double t)

{
  double dVar1;
  
  if (t < 0.25) {
    Music_Emu::set_tempo(&this->super_Music_Emu,0.25);
    return;
  }
  if ((this->blip_buf).sample_rate_ != 0) {
    dVar1 = (this->super_Music_Emu).tempo_;
    this->clocks_per_frame = (blargg_long)(long)(59667.0 / dVar1);
    Dual_Resampler::resize
              (&this->super_Dual_Resampler,
               (int)(long)((double)(this->super_Music_Emu).sample_rate_ / (dVar1 * 60.0)));
    return;
  }
  return;
}

Assistant:

void Gym_Emu::set_tempo_( double t )
{
	if ( t < min_tempo )
	{
		set_tempo( min_tempo );
		return;
	}
	
	if ( blip_buf.sample_rate() )
	{
		clocks_per_frame = long (clock_rate / 60 / tempo());
		Dual_Resampler::resize( long (sample_rate() / (60.0 * tempo())) );
	}
}